

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O3

void setallfields(lua_State *L,tm *stm)

{
  lua_pushinteger(L,(long)stm->tm_sec);
  lua_setfield(L,-2,"sec");
  lua_pushinteger(L,(long)stm->tm_min);
  lua_setfield(L,-2,"min");
  lua_pushinteger(L,(long)stm->tm_hour);
  lua_setfield(L,-2,"hour");
  lua_pushinteger(L,(long)stm->tm_mday);
  lua_setfield(L,-2,"day");
  lua_pushinteger(L,(long)stm->tm_mon + 1);
  lua_setfield(L,-2,"month");
  lua_pushinteger(L,(long)stm->tm_year + 0x76c);
  lua_setfield(L,-2,"year");
  lua_pushinteger(L,(long)stm->tm_wday + 1);
  lua_setfield(L,-2,"wday");
  lua_pushinteger(L,(long)stm->tm_yday + 1);
  lua_setfield(L,-2,"yday");
  if (-1 < stm->tm_isdst) {
    lua_pushboolean(L,stm->tm_isdst);
    lua_setfield(L,-2,"isdst");
    return;
  }
  return;
}

Assistant:

static void setallfields (lua_State *L, struct tm *stm) {
  setfield(L, "sec", stm->tm_sec);
  setfield(L, "min", stm->tm_min);
  setfield(L, "hour", stm->tm_hour);
  setfield(L, "day", stm->tm_mday);
  setfield(L, "month", stm->tm_mon + 1);
  setfield(L, "year", stm->tm_year + 1900);
  setfield(L, "wday", stm->tm_wday + 1);
  setfield(L, "yday", stm->tm_yday + 1);
  setboolfield(L, "isdst", stm->tm_isdst);
}